

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra.c
# Opt level: O0

void Gia_ManEraHashResize(Gia_ManEra_t *p)

{
  uint *__ptr;
  int iVar1;
  int iVar2;
  uint *puVar3;
  int local_54;
  Gia_ObjEra_t *local_50;
  int local_44;
  Gia_ObjEra_t *local_40;
  int local_38;
  int local_34;
  int i;
  int Counter;
  int iNext;
  int nBinsOld;
  uint *piPlace;
  uint *pBinsOld;
  Gia_ObjEra_t *pThis;
  Gia_ManEra_t *p_local;
  
  if (p->pBins == (uint *)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra.c"
                  ,0xea,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
  }
  __ptr = p->pBins;
  iVar2 = p->nBins;
  iVar1 = Abc_PrimeCudd(p->nBins * 3);
  p->nBins = iVar1;
  puVar3 = (uint *)calloc((long)p->nBins,4);
  p->pBins = puVar3;
  local_34 = 0;
  local_38 = 0;
  do {
    if (iVar2 <= local_38) {
      iVar2 = Vec_PtrSize(p->vStates);
      if (local_34 != iVar2 + -1) {
        __assert_fail("Counter == Vec_PtrSize( p->vStates ) - 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra.c"
                      ,0xff,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
      }
      if (__ptr != (uint *)0x0) {
        free(__ptr);
      }
      return;
    }
    if (__ptr[local_38] == 0) {
      local_40 = (Gia_ObjEra_t *)0x0;
    }
    else {
      local_40 = Gia_ManEraState(p,__ptr[local_38]);
    }
    pBinsOld = (uint *)local_40;
    if (local_40 == (Gia_ObjEra_t *)0x0) {
      local_44 = 0;
    }
    else {
      local_44 = local_40->iNext;
    }
    i = local_44;
    while (pBinsOld != (uint *)0x0) {
      if (*pBinsOld == 0) {
        __assert_fail("pThis->Num",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra.c"
                      ,0xf8,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
      }
      pBinsOld[3] = 0;
      puVar3 = Gia_ManEraHashFind(p,(Gia_ObjEra_t *)pBinsOld,(int *)0x0);
      if (*puVar3 != 0) {
        __assert_fail("*piPlace == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra.c"
                      ,0xfb,"void Gia_ManEraHashResize(Gia_ManEra_t *)");
      }
      *puVar3 = *pBinsOld;
      local_34 = local_34 + 1;
      if (i == 0) {
        local_50 = (Gia_ObjEra_t *)0x0;
      }
      else {
        local_50 = Gia_ManEraState(p,i);
      }
      pBinsOld = (uint *)local_50;
      if (local_50 == (Gia_ObjEra_t *)0x0) {
        local_54 = 0;
      }
      else {
        local_54 = local_50->iNext;
      }
      i = local_54;
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

void Gia_ManEraHashResize( Gia_ManEra_t * p )
{
    Gia_ObjEra_t * pThis;
    unsigned * pBinsOld, * piPlace;
    int nBinsOld, iNext, Counter, i;
    assert( p->pBins != NULL );
    // replace the table
    pBinsOld = p->pBins;
    nBinsOld = p->nBins;
    p->nBins = Abc_PrimeCudd( 3 * p->nBins ); 
    p->pBins = ABC_CALLOC( unsigned, p->nBins );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nBinsOld; i++ )
    for ( pThis = (pBinsOld[i]? Gia_ManEraState(p, pBinsOld[i]) : NULL),
          iNext = (pThis? pThis->iNext : 0);  
          pThis;  pThis = (iNext? Gia_ManEraState(p, iNext) : NULL),   
          iNext = (pThis? pThis->iNext : 0)  )
    {
        assert( pThis->Num );
        pThis->iNext = 0;
        piPlace = Gia_ManEraHashFind( p, pThis, NULL );
        assert( *piPlace == 0 ); // should not be there
        *piPlace = pThis->Num;
        Counter++;
    }
    assert( Counter == Vec_PtrSize( p->vStates ) - 1 );
    ABC_FREE( pBinsOld );
}